

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_(Formatter *this,App *sub,AppFormatMode mode)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  undefined4 in_ECX;
  App *in_RDX;
  long *in_RSI;
  string *in_RDI;
  bool in_stack_00000077;
  string *in_stack_00000078;
  size_t in_stack_00000080;
  string *in_stack_00000088;
  ostream *in_stack_00000090;
  stringstream out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcc0;
  allocator local_2c1;
  string local_2c0 [7];
  undefined1 in_stack_fffffffffffffd47;
  App *in_stack_fffffffffffffd48;
  size_t in_stack_fffffffffffffd60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd68;
  ostream *in_stack_fffffffffffffd70;
  string local_280 [32];
  string local_260 [32];
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  string local_1f8 [48];
  string local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [228];
  AppFormatMode in_stack_ffffffffffffff4c;
  App *in_stack_ffffffffffffff50;
  Formatter *in_stack_ffffffffffffff58;
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  App::get_display_name_abi_cxx11_(in_stack_fffffffffffffd48,(bool)in_stack_fffffffffffffd47);
  poVar2 = ::std::operator<<(local_198,local_1c8);
  ::std::operator<<(poVar2,'\n');
  ::std::__cxx11::string::~string(local_1c8);
  (**(code **)(*in_RSI + 0x48))(local_1f8,in_RSI,in_RDX);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_218,"  ",&local_219);
  detail::streamOutAsParagraph
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             in_stack_00000077);
  ::std::__cxx11::string::~string(local_218);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_219);
  ::std::__cxx11::string::~string(local_1f8);
  App::get_name_abi_cxx11_(in_RDX);
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    App::get_aliases_abi_cxx11_(in_RDX);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_fffffffffffffcc0);
    if (!bVar1) {
      App::get_aliases_abi_cxx11_(in_RDX);
      detail::format_aliases
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    }
  }
  (**(code **)(*in_RSI + 0x20))(local_240,in_RSI,in_RDX);
  ::std::operator<<(local_198,local_240);
  ::std::__cxx11::string::~string(local_240);
  make_groups_abi_cxx11_
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  ::std::operator<<(local_198,local_260);
  ::std::__cxx11::string::~string(local_260);
  (**(code **)(*in_RSI + 0x28))(local_280,in_RSI,in_RDX,in_ECX);
  ::std::operator<<(local_198,local_280);
  ::std::__cxx11::string::~string(local_280);
  (**(code **)(*in_RSI + 0x40))(&stack0xfffffffffffffd60,in_RSI,in_RDX);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_2c0,"",&local_2c1);
  detail::streamOutAsParagraph
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             in_stack_00000077);
  ::std::__cxx11::string::~string(local_2c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffd60);
  ::std::operator<<(local_198,'\n');
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_expanded(const App *sub, AppFormatMode mode) const {
    std::stringstream out;
    out << sub->get_display_name(true) << '\n';

    detail::streamOutAsParagraph(
        out, make_description(sub), description_paragraph_width_, "  ");  // Format description as paragraph

    if(sub->get_name().empty() && !sub->get_aliases().empty()) {
        detail::format_aliases(out, sub->get_aliases(), column_width_ + 2);
    }

    out << make_positionals(sub);
    out << make_groups(sub, mode);
    out << make_subcommands(sub, mode);
    detail::streamOutAsParagraph(out, make_footer(sub), footer_paragraph_width_);  // Format footer as paragraph

    out << '\n';
    return out.str();
}